

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Scaler::Scaler(Scaler *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Scaler_0072c2a8;
  (this->scalevalue_).current_size_ = 0;
  (this->scalevalue_).total_size_ = 0;
  (this->scalevalue_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->shiftvalue_).current_size_ = 0;
  (this->shiftvalue_).total_size_ = 0;
  (this->shiftvalue_).rep_ = (Rep *)0x0;
  if (this != (Scaler *)&_Scaler_default_instance_) {
    protobuf_Scaler_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

Scaler::Scaler()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Scaler_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Scaler)
}